

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManLutLevel(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint uVar7;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_t __nmemb;
  ulong uVar14;
  
  iVar1 = p->nObjs;
  __nmemb = (size_t)iVar1;
  __ptr = calloc(__nmemb,4);
  if (1 < (long)__nmemb) {
    pVVar5 = p->vMapping;
    uVar2 = pVVar5->nSize;
    uVar9 = 1;
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    uVar11 = 1;
    do {
      if (uVar11 == uVar9) {
LAB_006ba05d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = pVVar5->pArray;
      uVar3 = piVar6[uVar11];
      uVar13 = (ulong)uVar3;
      if (uVar13 != 0) {
        if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_006ba05d;
        uVar3 = piVar6[uVar13];
        uVar7 = uVar3;
        if ((int)uVar3 < 1) {
          uVar7 = 0;
        }
        if ((int)uVar3 < 1) {
          iVar12 = 1;
        }
        else {
          iVar12 = 0;
          uVar14 = 0;
          do {
            iVar4 = *(int *)((long)__ptr + (long)piVar6[uVar13 + uVar14 + 1] * 4);
            if (iVar4 < iVar12) {
              iVar4 = iVar12;
            }
            iVar12 = iVar4;
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
          iVar12 = iVar12 + 1;
        }
        *(int *)((long)__ptr + uVar11 * 4) = iVar12;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != __nmemb);
  }
  lVar8 = (long)p->vCos->nSize;
  if (lVar8 < 1) {
    iVar12 = 0;
LAB_006ba043:
    if (__ptr == (void *)0x0) {
      return iVar12;
    }
  }
  else {
    lVar10 = 0;
    iVar12 = 0;
    do {
      iVar4 = p->vCos->pArray[lVar10];
      if (((long)iVar4 < 0) || (iVar1 <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_006ba043;
      iVar4 = *(int *)((long)__ptr +
                      (long)(int)(iVar4 - (*(uint *)(p->pObjs + iVar4) & 0x1fffffff)) * 4);
      if (iVar12 <= iVar4) {
        iVar12 = iVar4;
      }
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  free(__ptr);
  return iVar12;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
        if ( Level < pLevels[Gia_ObjFaninId0p(p, pObj)] )
            Level = pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );
    return Level;
}